

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void glslang::RetargetVariable(char *from,char *to,TSymbolTable *symbolTable)

{
  TSymbolTable *__s;
  pool_allocator<char> local_80;
  TString local_78;
  pool_allocator<char> local_50;
  TString local_48;
  TSymbolTable *local_20;
  TSymbolTable *symbolTable_local;
  char *to_local;
  char *from_local;
  
  local_20 = symbolTable;
  symbolTable_local = (TSymbolTable *)to;
  to_local = from;
  pool_allocator<char>::pool_allocator(&local_50);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,
             from,&local_50);
  __s = symbolTable_local;
  pool_allocator<char>::pool_allocator(&local_80);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_78,
             (char *)__s,&local_80);
  TSymbolTable::retargetSymbol(symbolTable,&local_48,&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_48);
  return;
}

Assistant:

static void RetargetVariable(const char* from, const char* to, TSymbolTable& symbolTable)
{
    symbolTable.retargetSymbol(from, to);
}